

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilterBase.cpp
# Opt level: O2

void __thiscall
UnscentedKalmanFilterBase_computeSigmaPointMeasurements_Test::TestBody
          (UnscentedKalmanFilterBase_computeSigmaPointMeasurements_Test *this)

{
  DenseBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *this_00;
  PlainObjectBase<Eigen::Matrix<float,2,7,0,2,7>> *this_01;
  CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *pCVar1;
  Scalar *pSVar2;
  long row;
  char *pcVar3;
  long col;
  undefined1 local_204 [8];
  ConcreteUKF<Kalman::Vector<float,_3>_> ukf;
  QuadraticMeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>_> model;
  Matrix<T,_2,_7> tmp;
  template_SigmaPoints<Vector<T,_2>_> points;
  Matrix<T,_2,_7> ref;
  Scalar local_88;
  Scalar local_84;
  Scalar local_80;
  Scalar local_7c;
  Scalar local_78;
  Scalar local_74;
  Scalar local_70;
  Scalar local_6c;
  Scalar local_68;
  Scalar local_64;
  Scalar local_60;
  Scalar local_5c;
  Scalar local_58;
  float local_54;
  Scalar local_50 [2];
  AssertionResult gtest_ar;
  AssertHelper local_38;
  
  Kalman::UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>::UnscentedKalmanFilterBase
            ((UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)local_204,1.0,2.0,1.0);
  model.
  super_MeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>,_Kalman::StandardBase>.
  _8_8_ = 0;
  model.
  super_MeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>,_Kalman::StandardBase>.
  super_StandardBase<Kalman::Vector<float,_2>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] = 0.0;
  model.
  super_MeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>,_Kalman::StandardBase>.
  super_StandardBase<Kalman::Vector<float,_2>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1] = 0.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma = 0.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda = 0.0;
  model.
  super_MeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>,_Kalman::StandardBase>.
  _vptr_MeasurementModel = (_func_int **)0x0;
  Kalman::Test::Models::
  QuadraticMeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>_>::
  QuadraticMeasurementModel
            ((QuadraticMeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>_> *)
             &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma);
  this_00 = (DenseBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *)
            ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_c.
                    super_Matrix<float,_7,_1>.
                    super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.m_data +
            0x14);
  tmp.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0] = 0.0;
  tmp.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[1] = 0.0;
  tmp.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[2] =
       1.4013e-45;
  tmp.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[3] = 0.0;
  tmp.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[4] =
       1.4013e-45;
  tmp.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[5] = 0.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_c.
  super_Matrix<float,_7,_1>.super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.
  m_data.array[5] = 1.0;
  points.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0xc] =
       2.0;
  model.
  super_MeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>,_Kalman::StandardBase>.
  super_StandardBase<Kalman::Vector<float,_2>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array._8_8_ = this_00
  ;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *)
                      ((long)&model.
                              super_MeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>,_Kalman::StandardBase>
                              .super_StandardBase<Kalman::Vector<float,_2>_>.P.
                              super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.
                              m_data + 8),
                      points.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.
                      m_data.array + 0xc);
  tmp.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0xc] = 3.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,tmp.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                             m_storage.m_data.array + 0xc);
  local_50[0] = 4.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_(pCVar1,local_50)
  ;
  gtest_ar.message_.ptr_._0_4_ = 0x40a00000;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,(Scalar *)&gtest_ar.message_);
  local_38.data_._0_4_ = 0x40c00000;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,(Scalar *)&local_38);
  ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0xc] = 7.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                             m_storage.m_data.array + 0xc);
  ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0xd] = 8.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                             m_storage.m_data.array + 0xd);
  local_88 = 9.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,&local_88);
  local_84 = 10.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,&local_84);
  local_80 = 11.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,&local_80);
  local_7c = 12.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,&local_7c);
  local_78 = 13.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,&local_78);
  local_74 = 14.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,&local_74);
  local_70 = 15.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,&local_70);
  local_6c = 16.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,&local_6c);
  local_68 = 17.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,&local_68);
  local_64 = 18.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,&local_64);
  local_60 = 19.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,&local_60);
  local_5c = 20.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar1,&local_5c);
  local_58 = 21.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_(pCVar1,&local_58);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *)
             ((long)&model.
                     super_MeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>,_Kalman::StandardBase>
                     .super_StandardBase<Kalman::Vector<float,_2>_>.P.
                     super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data +
             8));
  Eigen::DenseBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::topRows<2>
            ((Type *)(points.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.
                      m_data.array + 0xc),this_00,2);
  this_01 = (PlainObjectBase<Eigen::Matrix<float,2,7,0,2,7>> *)
            ((long)&model.
                    super_MeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>,_Kalman::StandardBase>
                    .super_StandardBase<Kalman::Vector<float,_2>_>.P.
                    super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data + 8
            );
  Eigen::PlainObjectBase<Eigen::Matrix<float,2,7,0,2,7>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<float,3,7,0,3,7>,2,7,false>>
            (this_01,(DenseBase<Eigen::Block<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_2,_7,_false>_> *)
                     (points.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.
                      m_data.array + 0xc));
  tmp.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array._48_8_ =
       this_01;
  points.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array._0_8_ =
       this_01;
  Eigen::PlainObjectBase<Eigen::Matrix<float,2,7,0,2,7>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Matrix<float,2,7,0,2,7>const,Eigen::Matrix<float,2,7,0,2,7>const>>
            ((PlainObjectBase<Eigen::Matrix<float,2,7,0,2,7>> *)
             (points.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
              array + 0xc),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,_2,_7,_0,_2,_7>,_const_Eigen::Matrix<float,_2,_7,_0,_2,_7>_>_>
              *)(tmp.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
                 array + 0xc));
  Kalman::UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>::
  computeSigmaPointMeasurements<Kalman::Vector<float,_2>,_Kalman::StandardBase>
            ((UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)local_204,
             (MeasurementModelType<Kalman::Vector<float,_2>,_Kalman::StandardBase> *)
             &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma,
             (SigmaPoints<Kalman::Vector<float,_2>_> *)
             (tmp.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
             + 0xc));
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_38.data_ = (AssertHelperData *)0x2;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_50,"ref.rows()","points.rows()",(long *)&gtest_ar.message_,
             (long *)&local_38);
  if (local_50[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7;
    local_38.data_ = (AssertHelperData *)0x7;
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)local_50,"ref.cols()","points.cols()",(long *)&gtest_ar.message_,
               (long *)&local_38);
    if (local_50[0]._0_1_ != (internal)0x0) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      row = 0;
      do {
        if (row == 2) {
          return;
        }
        for (col = 0; col != 7; col = col + 1) {
          pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>,_1> *)
                              (points.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                               m_storage.m_data.array + 0xc),row,col);
          local_54 = *pSVar2;
          pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>,_1> *)
                              (tmp.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                               m_storage.m_data.array + 0xc),row,col);
          testing::internal::DoubleNearPredFormat
                    ((internal *)local_50,"ref(i,j)","points(i,j)","1e-10",(double)local_54,
                     (double)*pSVar2,1e-10);
          if (local_50[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&gtest_ar.message_);
            if (gtest_ar._0_8_ == 0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                       ,0x61,pcVar3);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar.message_);
            testing::internal::AssertHelper::~AssertHelper(&local_38);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar.message_);
            goto LAB_00184a93;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar);
        }
        row = row + 1;
      } while( true );
    }
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar.message_);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar.message_);
LAB_00184a93:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  return;
}

Assistant:

TEST(UnscentedKalmanFilterBase, computeSigmaPointMeasurements) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = ConcreteUKF<Vector<T, 3>>(alpha,beta,kappa);
    auto model = Kalman::Test::Models::QuadraticMeasurementModel<Vector<T, 3>, Vector<T, 2>>();
    
    // Init variables
    ukf.sigmaStatePoints <<
         1,  2,  3,  4,  5,  6,  7,
         8,  9, 10, 11, 12, 13, 14,
        15, 16, 17, 18, 19, 20, 21;
    
    // Compute Reference result
    Matrix<T,2,7> tmp = ukf.sigmaStatePoints.template topRows<2>();
    Matrix<T,2,7> ref = tmp.cwiseProduct(tmp).eval();
    
    typename ConcreteUKF<Vector<T,3>>::template SigmaPoints<Vector<T,2>> points;
    
    ukf.computeSigmaPointMeasurements(model, points);
    
    // Compare ref and result
    ASSERT_MATRIX_NEAR(ref, points, 1e-10);
}